

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserParserTest_Create_Test::TestBody(BioparserParserTest_Create_Test *this)

{
  AssertionResult gtest_ar;
  invalid_argument *exception;
  allocator local_39;
  string local_38;
  unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  p;
  BioparserParserTest_Create_Test *this_local;
  
  p._M_t.
  super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl =
       (__uniq_ptr_data<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>,_true,_true>
        )(__uniq_ptr_data<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  Parser<biosoup::Sequence>::Create<bioparser::FastaParser>
            ((Parser<biosoup::Sequence> *)&stack0xffffffffffffffe8,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::
  unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
  ::~unique_ptr((unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
                 *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

TEST(BioparserParserTest, Create) {
  try {
    auto p = Parser<biosoup::Sequence>::Create<FastaParser>("");
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::Parser::Create] error: unable to open file ");
  }
}